

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

TValue * get_equalTM(lua_State *L,Table *mt1,Table *mt2,TMS event)

{
  int iVar1;
  TValue *local_60;
  TValue *local_58;
  lua_State *local_50;
  lua_State *local_48;
  TValue *tm2;
  TValue *tm1;
  TMS event_local;
  Table *mt2_local;
  Table *mt1_local;
  lua_State *L_local;
  
  if (mt1 == (Table *)0x0) {
    local_48 = (lua_State *)0x0;
  }
  else {
    if (((uint)mt1->flags & 1 << ((byte)event & 0x1f)) == 0) {
      local_50 = (lua_State *)luaT_gettm(mt1,event,L->l_G->tmname[event]);
    }
    else {
      local_50 = (lua_State *)0x0;
    }
    local_48 = local_50;
  }
  if (local_48 == (lua_State *)0x0) {
    L_local = (lua_State *)0x0;
  }
  else if (mt1 == mt2) {
    L_local = local_48;
  }
  else {
    if (mt2 == (Table *)0x0) {
      local_58 = (TValue *)0x0;
    }
    else {
      if (((uint)mt2->flags & 1 << ((byte)event & 0x1f)) == 0) {
        local_60 = luaT_gettm(mt2,event,L->l_G->tmname[event]);
      }
      else {
        local_60 = (TValue *)0x0;
      }
      local_58 = local_60;
    }
    if (local_58 == (TValue *)0x0) {
      L_local = (lua_State *)0x0;
    }
    else {
      if ((*(int *)&local_48->tt == local_58->tt_) &&
         (iVar1 = luaV_equalobj_((lua_State *)0x0,(TValue *)local_48,local_58), iVar1 != 0)) {
        return (TValue *)local_48;
      }
      L_local = (lua_State *)0x0;
    }
  }
  return (TValue *)L_local;
}

Assistant:

static const TValue *get_equalTM (lua_State *L, Table *mt1, Table *mt2,
                                  TMS event) {
  const TValue *tm1 = fasttm(L, mt1, event);
  const TValue *tm2;
  if (tm1 == NULL) return NULL;  /* no metamethod */
  if (mt1 == mt2) return tm1;  /* same metatables => same metamethods */
  tm2 = fasttm(L, mt2, event);
  if (tm2 == NULL) return NULL;  /* no metamethod */
  if (luaV_rawequalobj(tm1, tm2))  /* same metamethods? */
    return tm1;
  return NULL;
}